

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# java_extension.cc
# Opt level: O2

int __thiscall
google::protobuf::compiler::java::ImmutableExtensionGenerator::GenerateRegistrationCode
          (ImmutableExtensionGenerator *this,Printer *printer)

{
  FieldDescriptor *in_RDX;
  string local_40;
  
  UnderscoresToCamelCaseCheckReserved_abi_cxx11_(&local_40,(java *)this->descriptor_,in_RDX);
  io::Printer::Print<char[6],std::__cxx11::string,char[5],std::__cxx11::string>
            (printer,"registry.add($scope$.$name$);\n",(char (*) [6])"scope",&this->scope_,
             (char (*) [5])0x2d29e2,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  return 7;
}

Assistant:

int ImmutableExtensionGenerator::GenerateRegistrationCode(
    io::Printer* printer) {
  printer->Print("registry.add($scope$.$name$);\n", "scope", scope_, "name",
                 UnderscoresToCamelCaseCheckReserved(descriptor_));
  return 7;
}